

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateSerializedSizeCode
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "for (java.util.Map.Entry<$type_parameters$> entry\n     : internalGet$capitalized_name$().entrySet()) {\n  size += $default_entry$.computeMessageSize(\n    $number$, entry.getKey(), entry.getValue());\n}\n"
                    );
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(
      variables_,
      "for (java.util.Map.Entry<$type_parameters$> entry\n"
      "     : internalGet$capitalized_name$().entrySet()) {\n"
      "  size += $default_entry$.computeMessageSize(\n"
      "    $number$, entry.getKey(), entry.getValue());\n"
      "}\n");
}